

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerCountZeros(I64ToI32Lowering *this,Unary *curr)

{
  Block *result;
  undefined1 local_60 [8];
  TempVar highBits;
  TempVar lowBits;
  anon_class_8_1_8991fb9c lower;
  
  lowBits.ty.id = (uintptr_t)this;
  fetchOutParam((TempVar *)local_60,this,curr->value);
  getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
  if ((char)lowBits.pass == '\x01') {
    __assert_fail("!moved",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
  }
  result = (Block *)Builder::makeLocalSet
                              ((this->builder)._M_t.
                               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                               .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                               (Index)highBits.ty.id,curr->value);
  if ((result == (Block *)0x0) ||
     ((((SpecificExpression<(wasm::Expression::Id)9> *)
       &result->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id != BlockId
     )) {
    result = Builder::makeBlock((this->builder)._M_t.
                                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                                (Expression *)result);
  }
  if (curr->op == ClzInt64) {
    lowerCountZeros::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&lowBits.ty,result,ClzInt32,(TempVar *)local_60,
               (TempVar *)&highBits.ty);
    TempVar::~TempVar((TempVar *)&highBits.ty);
    TempVar::~TempVar((TempVar *)local_60);
    return;
  }
  if (curr->op == CtzInt64) {
    handle_unreachable("i64.ctz should be removed already",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                       ,899);
  }
  abort();
}

Assistant:

void lowerCountZeros(Unary* curr) {
    auto lower = [&](Block* result,
                     UnaryOp op32,
                     TempVar&& first,
                     TempVar&& second) {
      TempVar highResult = getTemp();
      TempVar firstResult = getTemp();
      LocalSet* setFirst = builder->makeLocalSet(
        firstResult,
        builder->makeUnary(op32, builder->makeLocalGet(first, Type::i32)));

      Binary* check =
        builder->makeBinary(EqInt32,
                            builder->makeLocalGet(firstResult, Type::i32),
                            builder->makeConst(int32_t(32)));

      If* conditional = builder->makeIf(
        check,
        builder->makeBinary(
          AddInt32,
          builder->makeUnary(op32, builder->makeLocalGet(second, Type::i32)),
          builder->makeConst(int32_t(32))),
        builder->makeLocalGet(firstResult, Type::i32));

      LocalSet* setHigh =
        builder->makeLocalSet(highResult, builder->makeConst(int32_t(0)));

      setOutParam(result, std::move(highResult));

      replaceCurrent(builder->blockify(result, setFirst, setHigh, conditional));
    };

    TempVar highBits = fetchOutParam(curr->value);
    TempVar lowBits = getTemp();
    LocalSet* setLow = builder->makeLocalSet(lowBits, curr->value);
    Block* result = builder->blockify(setLow);

    switch (curr->op) {
      case ClzInt64:
        lower(result, ClzInt32, std::move(highBits), std::move(lowBits));
        break;
      case CtzInt64:
        WASM_UNREACHABLE("i64.ctz should be removed already");
        break;
      default:
        abort();
    }
  }